

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O2

void glob_cleanup(URLGlob *glob)

{
  char **__ptr;
  ulong uVar1;
  anon_union_24_3_e2f18bb4_for_content *paVar2;
  ulong uVar3;
  
  uVar1 = glob->size;
  uVar3 = uVar1;
  do {
    uVar3 = uVar3 - 1;
    if (uVar1 <= uVar3) {
      free(glob->glob_buffer);
      free(glob);
      return;
    }
    uVar1 = uVar3 >> 1;
    if ((uVar3 & 1) == 0) {
      __ptr = (char **)glob->literal[uVar1];
      if (__ptr != (char **)0x0) {
        paVar2 = (anon_union_24_3_e2f18bb4_for_content *)(glob->literal + uVar1);
LAB_00111e65:
        free(__ptr);
        (paVar2->Set).elements = (char **)0x0;
      }
    }
    else if ((glob->pattern[uVar1].type == UPTSet) &&
            (glob->pattern[uVar1].content.Set.elements != (char **)0x0)) {
      paVar2 = &glob->pattern[uVar1].content;
      for (uVar1 = (ulong)(uint)(int)glob->pattern[uVar1].content.Set.size;
          __ptr = (paVar2->Set).elements, 0 < (int)uVar1; uVar1 = uVar1 - 1) {
        if (__ptr[uVar1 - 1] != (char *)0x0) {
          free(__ptr[uVar1 - 1]);
          (paVar2->Set).elements[uVar1 - 1] = (char *)0x0;
        }
      }
      if (__ptr != (char **)0x0) goto LAB_00111e65;
    }
    uVar1 = glob->size;
  } while( true );
}

Assistant:

void glob_cleanup(URLGlob* glob)
{
  size_t i;
  int elem;

  for(i = glob->size - 1; i < glob->size; --i) {
    if(!(i & 1)) {     /* even indexes contain literals */
      Curl_safefree(glob->literal[i/2]);
    }
    else {              /* odd indexes contain sets or ranges */
      if((glob->pattern[i/2].type == UPTSet) &&
         (glob->pattern[i/2].content.Set.elements)) {
        for(elem = glob->pattern[i/2].content.Set.size - 1;
             elem >= 0;
             --elem) {
          Curl_safefree(glob->pattern[i/2].content.Set.elements[elem]);
        }
        Curl_safefree(glob->pattern[i/2].content.Set.elements);
      }
    }
  }
  Curl_safefree(glob->glob_buffer);
  Curl_safefree(glob);
}